

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

void __thiscall foxxll::file::~file(file *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~file()
    {
        const size_t nr = get_request_nref();
        if (nr != 0) {
            TLX_LOG1 << "foxxll::file is being deleted while there are still "
                     << nr << " (unfinished) requests referencing it";
        }
    }